

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [16];
  int iVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  int iVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  byte bVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  float fVar41;
  uint uVar42;
  float fVar59;
  float fVar61;
  vint4 bi;
  uint uVar60;
  uint uVar62;
  float fVar64;
  uint uVar65;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar63;
  float fVar66;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar58;
  float fVar67;
  float fVar75;
  vint4 bi_1;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar76;
  float fVar84;
  float fVar87;
  vint4 ai;
  uint uVar77;
  float fVar78;
  uint uVar85;
  uint uVar88;
  float fVar89;
  uint uVar90;
  StackItemT<embree::NodeRefPtr<4>_> SVar79;
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  float fVar97;
  float fVar98;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar92;
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar150 [16];
  float fVar154;
  int iVar155;
  float fVar158;
  int iVar159;
  float fVar160;
  int iVar161;
  float fVar162;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar163;
  float fVar164;
  int iVar165;
  float fVar166;
  int iVar167;
  float fVar168;
  int iVar169;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  float fStack_12b4;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  float fStack_1284;
  vbool<4> valid;
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined1 local_1238 [16];
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  ulong local_1208;
  float fStack_1200;
  float fStack_11fc;
  RTCFilterFunctionNArguments args;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  int local_ff8;
  int iStack_ff4;
  int iStack_ff0;
  int iStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar116 [16];
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar78 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar135 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar113 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar163 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar164 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar26 = (tray->tnear).field_0.i[k];
  iVar165 = (tray->tfar).field_0.i[k];
  local_1008 = mm_lookupmask_ps._0_8_;
  uStack_1000 = mm_lookupmask_ps._8_8_;
  uVar34 = 1 << ((byte)k & 0x1f);
  uVar35 = (ulong)uVar34;
  local_1018 = mm_lookupmask_ps._240_8_;
  uStack_1010 = mm_lookupmask_ps._248_8_;
  local_f98 = fVar78;
  fStack_f94 = fVar78;
  fStack_f90 = fVar78;
  fStack_f8c = fVar78;
  local_fa8 = fVar86;
  fStack_fa4 = fVar86;
  fStack_fa0 = fVar86;
  fStack_f9c = fVar86;
  local_fb8 = fVar135;
  fStack_fb4 = fVar135;
  fStack_fb0 = fVar135;
  fStack_fac = fVar135;
  local_fc8 = fVar113;
  fStack_fc4 = fVar113;
  fStack_fc0 = fVar113;
  fStack_fbc = fVar113;
  local_fd8 = fVar163;
  fStack_fd4 = fVar163;
  fStack_fd0 = fVar163;
  fStack_fcc = fVar163;
  local_fe8 = fVar164;
  fStack_fe4 = fVar164;
  fStack_fe0 = fVar164;
  fStack_fdc = fVar164;
  local_ff8 = iVar26;
  iStack_ff4 = iVar26;
  iStack_ff0 = iVar26;
  iStack_fec = iVar26;
  iVar161 = iVar26;
  iVar159 = iVar26;
  iVar155 = iVar26;
  fVar75 = fVar163;
  fVar67 = fVar163;
  fVar144 = fVar163;
  iVar27 = iVar165;
  iVar169 = iVar165;
  iVar167 = iVar165;
  fVar141 = fVar164;
  fVar138 = fVar164;
  fVar134 = fVar164;
  fVar66 = fVar113;
  fVar63 = fVar113;
  fVar162 = fVar113;
  fVar160 = fVar135;
  fVar158 = fVar135;
  fVar154 = fVar135;
  fVar99 = fVar86;
  fVar98 = fVar86;
  fVar97 = fVar86;
  fVar91 = fVar78;
  fVar168 = fVar78;
  fVar166 = fVar78;
LAB_0026437e:
  do {
    pSVar25 = pSVar29 + -1;
    pSVar29 = pSVar29 + -1;
    if ((float)pSVar25->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar25->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar36 = (pSVar29->ptr).ptr;
      while ((uVar36 & 8) == 0) {
        pfVar1 = (float *)(uVar36 + 0x20 + uVar37);
        fVar41 = (*pfVar1 - fVar166) * fVar162;
        fVar59 = (pfVar1[1] - fVar168) * fVar63;
        fVar61 = (pfVar1[2] - fVar91) * fVar66;
        fVar64 = (pfVar1[3] - fVar78) * fVar113;
        pfVar1 = (float *)(uVar36 + 0x20 + uVar39);
        fVar76 = (*pfVar1 - fVar97) * fVar144;
        fVar84 = (pfVar1[1] - fVar98) * fVar67;
        fVar87 = (pfVar1[2] - fVar99) * fVar75;
        fVar89 = (pfVar1[3] - fVar86) * fVar163;
        uVar77 = (uint)((int)fVar76 < (int)fVar41) * (int)fVar41 |
                 (uint)((int)fVar76 >= (int)fVar41) * (int)fVar76;
        uVar85 = (uint)((int)fVar84 < (int)fVar59) * (int)fVar59 |
                 (uint)((int)fVar84 >= (int)fVar59) * (int)fVar84;
        uVar88 = (uint)((int)fVar87 < (int)fVar61) * (int)fVar61 |
                 (uint)((int)fVar87 >= (int)fVar61) * (int)fVar87;
        uVar90 = (uint)((int)fVar89 < (int)fVar64) * (int)fVar64 |
                 (uint)((int)fVar89 >= (int)fVar64) * (int)fVar89;
        pfVar1 = (float *)(uVar36 + 0x20 + uVar40);
        fVar41 = (*pfVar1 - fVar154) * fVar134;
        fVar59 = (pfVar1[1] - fVar158) * fVar138;
        fVar61 = (pfVar1[2] - fVar160) * fVar141;
        fVar64 = (pfVar1[3] - fVar135) * fVar164;
        uVar42 = (uint)((int)fVar41 < iVar155) * iVar155 |
                 (uint)((int)fVar41 >= iVar155) * (int)fVar41;
        uVar60 = (uint)((int)fVar59 < iVar159) * iVar159 |
                 (uint)((int)fVar59 >= iVar159) * (int)fVar59;
        uVar62 = (uint)((int)fVar61 < iVar161) * iVar161 |
                 (uint)((int)fVar61 >= iVar161) * (int)fVar61;
        uVar65 = (uint)((int)fVar64 < iVar26) * iVar26 | (uint)((int)fVar64 >= iVar26) * (int)fVar64
        ;
        tNear.field_0.i[0] =
             ((int)uVar42 < (int)uVar77) * uVar77 | ((int)uVar42 >= (int)uVar77) * uVar42;
        tNear.field_0.i[1] =
             ((int)uVar60 < (int)uVar85) * uVar85 | ((int)uVar60 >= (int)uVar85) * uVar60;
        tNear.field_0.i[2] =
             ((int)uVar62 < (int)uVar88) * uVar88 | ((int)uVar62 >= (int)uVar88) * uVar62;
        tNear.field_0.i[3] =
             ((int)uVar65 < (int)uVar90) * uVar90 | ((int)uVar65 >= (int)uVar90) * uVar65;
        pfVar1 = (float *)(uVar36 + 0x20 + (uVar37 ^ 0x10));
        fVar41 = (*pfVar1 - fVar166) * fVar162;
        fVar59 = (pfVar1[1] - fVar168) * fVar63;
        fVar61 = (pfVar1[2] - fVar91) * fVar66;
        fVar64 = (pfVar1[3] - fVar78) * fVar113;
        pfVar1 = (float *)(uVar36 + 0x20 + (uVar39 ^ 0x10));
        fVar76 = (*pfVar1 - fVar97) * fVar144;
        fVar84 = (pfVar1[1] - fVar98) * fVar67;
        fVar87 = (pfVar1[2] - fVar99) * fVar75;
        fVar89 = (pfVar1[3] - fVar86) * fVar163;
        uVar77 = (uint)((int)fVar41 < (int)fVar76) * (int)fVar41 |
                 (uint)((int)fVar41 >= (int)fVar76) * (int)fVar76;
        uVar85 = (uint)((int)fVar59 < (int)fVar84) * (int)fVar59 |
                 (uint)((int)fVar59 >= (int)fVar84) * (int)fVar84;
        uVar88 = (uint)((int)fVar61 < (int)fVar87) * (int)fVar61 |
                 (uint)((int)fVar61 >= (int)fVar87) * (int)fVar87;
        uVar90 = (uint)((int)fVar64 < (int)fVar89) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar89) * (int)fVar89;
        pfVar1 = (float *)(uVar36 + 0x20 + (uVar40 ^ 0x10));
        fVar41 = (*pfVar1 - fVar154) * fVar134;
        fVar59 = (pfVar1[1] - fVar158) * fVar138;
        fVar61 = (pfVar1[2] - fVar160) * fVar141;
        fVar64 = (pfVar1[3] - fVar135) * fVar164;
        uVar42 = (uint)(iVar167 < (int)fVar41) * iVar167 |
                 (uint)(iVar167 >= (int)fVar41) * (int)fVar41;
        uVar60 = (uint)(iVar169 < (int)fVar59) * iVar169 |
                 (uint)(iVar169 >= (int)fVar59) * (int)fVar59;
        uVar62 = (uint)(iVar27 < (int)fVar61) * iVar27 | (uint)(iVar27 >= (int)fVar61) * (int)fVar61
        ;
        uVar65 = (uint)(iVar165 < (int)fVar64) * iVar165 |
                 (uint)(iVar165 >= (int)fVar64) * (int)fVar64;
        auVar82._0_4_ =
             -(uint)((int)(((int)uVar77 < (int)uVar42) * uVar77 |
                          ((int)uVar77 >= (int)uVar42) * uVar42) < tNear.field_0.i[0]);
        auVar82._4_4_ =
             -(uint)((int)(((int)uVar85 < (int)uVar60) * uVar85 |
                          ((int)uVar85 >= (int)uVar60) * uVar60) < tNear.field_0.i[1]);
        auVar82._8_4_ =
             -(uint)((int)(((int)uVar88 < (int)uVar62) * uVar88 |
                          ((int)uVar88 >= (int)uVar62) * uVar62) < tNear.field_0.i[2]);
        auVar82._12_4_ =
             -(uint)((int)(((int)uVar90 < (int)uVar65) * uVar90 |
                          ((int)uVar90 >= (int)uVar65) * uVar65) < tNear.field_0.i[3]);
        uVar42 = movmskps((int)uVar35,auVar82);
        uVar35 = (ulong)uVar42;
        if (uVar42 == 0xf) {
          if (pSVar29 == stack) {
            return;
          }
          goto LAB_0026437e;
        }
        bVar33 = (byte)uVar42 ^ 0xf;
        uVar32 = uVar36 & 0xfffffffffffffff0;
        uVar35 = 0;
        if (bVar33 != 0) {
          for (; (bVar33 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        uVar36 = *(ulong *)(uVar32 + uVar35 * 8);
        uVar42 = bVar33 - 1 & (uint)bVar33;
        if (uVar42 != 0) {
          uVar60 = tNear.field_0.i[uVar35];
          lVar38 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar32 + lVar38 * 8);
          uVar62 = tNear.field_0.i[lVar38];
          uVar42 = uVar42 - 1 & uVar42;
          uVar35 = (ulong)uVar42;
          if (uVar42 == 0) {
            if (uVar60 < uVar62) {
              (pSVar29->ptr).ptr = uVar31;
              pSVar29->dist = uVar62;
              pSVar29 = pSVar29 + 1;
            }
            else {
              (pSVar29->ptr).ptr = uVar36;
              pSVar29->dist = uVar60;
              pSVar29 = pSVar29 + 1;
              uVar36 = uVar31;
            }
          }
          else {
            auVar157._8_4_ = uVar60;
            auVar157._0_8_ = uVar36;
            auVar157._12_4_ = 0;
            auVar107._8_4_ = uVar62;
            auVar107._0_8_ = uVar31;
            auVar107._12_4_ = 0;
            lVar38 = 0;
            if (uVar35 != 0) {
              for (; (uVar42 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
            uVar7 = *(undefined8 *)(uVar32 + lVar38 * 8);
            iVar5 = tNear.field_0.i[lVar38];
            auVar115._8_4_ = iVar5;
            auVar115._0_8_ = uVar7;
            auVar115._12_4_ = 0;
            auVar108._8_4_ = -(uint)((int)uVar60 < (int)uVar62);
            uVar42 = uVar42 - 1 & uVar42;
            if (uVar42 == 0) {
              auVar108._4_4_ = auVar108._8_4_;
              auVar108._0_4_ = auVar108._8_4_;
              auVar108._12_4_ = auVar108._8_4_;
              auVar105._8_4_ = uVar62;
              auVar105._0_8_ = uVar31;
              auVar105._12_4_ = 0;
              auVar106 = blendvps(auVar105,auVar157,auVar108);
              auVar82 = blendvps(auVar157,auVar107,auVar108);
              auVar43._8_4_ = -(uint)(auVar106._8_4_ < iVar5);
              auVar43._4_4_ = auVar43._8_4_;
              auVar43._0_4_ = auVar43._8_4_;
              auVar43._12_4_ = auVar43._8_4_;
              auVar100._8_4_ = iVar5;
              auVar100._0_8_ = uVar7;
              auVar100._12_4_ = 0;
              auVar157 = blendvps(auVar100,auVar106,auVar43);
              auVar107 = blendvps(auVar106,auVar115,auVar43);
              auVar44._8_4_ = -(uint)(auVar82._8_4_ < auVar107._8_4_);
              auVar44._4_4_ = auVar44._8_4_;
              auVar44._0_4_ = auVar44._8_4_;
              auVar44._12_4_ = auVar44._8_4_;
              SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar107,auVar82,auVar44);
              SVar79 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar107,auVar44);
              *pSVar29 = SVar79;
              pSVar29[1] = SVar92;
              uVar36 = auVar157._0_8_;
              pSVar29 = pSVar29 + 2;
            }
            else {
              uVar35 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              auVar106._4_4_ = auVar108._8_4_;
              auVar106._0_4_ = auVar108._8_4_;
              auVar106._8_4_ = auVar108._8_4_;
              auVar106._12_4_ = auVar108._8_4_;
              auVar108 = blendvps(auVar107,auVar157,auVar106);
              auVar82 = blendvps(auVar157,auVar107,auVar106);
              auVar114._8_4_ = tNear.field_0.i[uVar35];
              auVar114._0_8_ = *(undefined8 *)(uVar32 + uVar35 * 8);
              auVar114._12_4_ = 0;
              auVar45._8_4_ = -(uint)(iVar5 < tNear.field_0.i[uVar35]);
              auVar45._4_4_ = auVar45._8_4_;
              auVar45._0_4_ = auVar45._8_4_;
              auVar45._12_4_ = auVar45._8_4_;
              auVar107 = blendvps(auVar114,auVar115,auVar45);
              auVar157 = blendvps(auVar115,auVar114,auVar45);
              auVar46._8_4_ = -(uint)(auVar82._8_4_ < auVar157._8_4_);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              auVar115 = blendvps(auVar157,auVar82,auVar46);
              SVar79 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar157,auVar46);
              auVar47._8_4_ = -(uint)(auVar108._8_4_ < auVar107._8_4_);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar82 = blendvps(auVar107,auVar108,auVar47);
              auVar157 = blendvps(auVar108,auVar107,auVar47);
              auVar48._8_4_ = -(uint)(auVar157._8_4_ < auVar115._8_4_);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar115,auVar157,auVar48);
              SVar109 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar157,auVar115,auVar48);
              *pSVar29 = SVar79;
              pSVar29[1] = SVar109;
              pSVar29[2] = SVar92;
              uVar36 = auVar82._0_8_;
              pSVar29 = pSVar29 + 3;
            }
          }
        }
      }
      uVar35 = (ulong)((uint)uVar36 & 0xf) - 8;
      if (uVar35 != 0) {
        uVar36 = uVar36 & 0xfffffffffffffff0;
        uVar32 = 0;
        do {
          lVar30 = uVar32 * 0xe0;
          puVar2 = (undefined8 *)(uVar36 + 0xd0 + lVar30);
          local_11b8 = *puVar2;
          uStack_11b0 = puVar2[1];
          pfVar1 = (float *)(uVar36 + lVar30);
          fVar163 = *pfVar1;
          fVar164 = pfVar1[1];
          fVar166 = pfVar1[2];
          fVar168 = pfVar1[3];
          pfVar1 = (float *)(uVar36 + 0x10 + lVar30);
          fVar91 = *pfVar1;
          fVar97 = pfVar1[1];
          fVar98 = pfVar1[2];
          fVar99 = pfVar1[3];
          pfVar1 = (float *)(uVar36 + 0x20 + lVar30);
          fVar154 = *pfVar1;
          fVar158 = pfVar1[1];
          fVar160 = pfVar1[2];
          fVar162 = pfVar1[3];
          pfVar1 = (float *)(uVar36 + 0x40 + lVar30);
          local_1248 = *(undefined8 *)pfVar1;
          uStack_1240 = *(undefined8 *)(pfVar1 + 2);
          fVar132 = fVar91 - *pfVar1;
          fVar136 = fVar97 - pfVar1[1];
          fVar139 = fVar98 - pfVar1[2];
          fVar142 = fVar99 - pfVar1[3];
          pfVar1 = (float *)(uVar36 + 0x50 + lVar30);
          local_12a8 = *(undefined8 *)pfVar1;
          uStack_12a0 = *(undefined8 *)(pfVar1 + 2);
          fVar120 = fVar154 - *pfVar1;
          fVar122 = fVar158 - pfVar1[1];
          fVar124 = fVar160 - pfVar1[2];
          fVar126 = fVar162 - pfVar1[3];
          pfVar3 = (float *)(uVar36 + 0x90 + lVar30);
          fVar63 = pfVar3[2];
          fVar66 = pfVar3[3];
          fVar149 = *pfVar3 - fVar163;
          fVar151 = pfVar3[1] - fVar164;
          fVar152 = fVar63 - fVar166;
          fVar153 = fVar66 - fVar168;
          pauVar4 = (undefined1 (*) [16])(uVar36 + 0xa0 + lVar30);
          auVar82 = *pauVar4;
          fVar61 = *(float *)*pauVar4 - fVar91;
          fVar64 = *(float *)(*pauVar4 + 4) - fVar97;
          fVar76 = *(float *)(*pauVar4 + 8) - fVar98;
          fVar84 = *(float *)(*pauVar4 + 0xc) - fVar99;
          pfVar1 = (float *)(uVar36 + 0xb0 + lVar30);
          fVar134 = *pfVar1;
          fVar138 = pfVar1[1];
          fVar141 = pfVar1[2];
          fVar144 = pfVar1[3];
          fVar87 = fVar134 - fVar154;
          fVar89 = fVar138 - fVar158;
          fVar118 = fVar141 - fVar160;
          fVar119 = fVar144 - fVar162;
          local_10f8[0] = fVar120 * fVar61 - fVar132 * fVar87;
          local_10f8[1] = fVar122 * fVar64 - fVar136 * fVar89;
          local_10f8[2] = fVar124 * fVar76 - fVar139 * fVar118;
          local_10f8[3] = fVar126 * fVar84 - fVar142 * fVar119;
          fVar78 = *(float *)(ray + k * 4);
          fVar86 = *(float *)(ray + k * 4 + 0x10);
          fVar135 = *(float *)(ray + k * 4 + 0x40);
          fStack_12b4 = *(float *)(ray + k * 4 + 0x50);
          local_f88 = fVar163 - fVar78;
          fStack_f84 = fVar164 - fVar78;
          fStack_f80 = fVar166 - fVar78;
          fStack_f7c = fVar168 - fVar78;
          fVar91 = fVar91 - fVar86;
          fVar97 = fVar97 - fVar86;
          fVar98 = fVar98 - fVar86;
          fVar99 = fVar99 - fVar86;
          fVar67 = local_f88 * fStack_12b4 - fVar91 * fVar135;
          fVar75 = fStack_f84 * fStack_12b4 - fVar97 * fVar135;
          fVar41 = fStack_f80 * fStack_12b4 - fVar98 * fVar135;
          fVar59 = fStack_f7c * fStack_12b4 - fVar99 * fVar135;
          pfVar1 = (float *)(uVar36 + 0x30 + lVar30);
          local_12c8 = *(undefined8 *)pfVar1;
          uStack_12c0 = *(undefined8 *)(pfVar1 + 2);
          fVar163 = fVar163 - *pfVar1;
          fVar164 = fVar164 - pfVar1[1];
          fVar166 = fVar166 - pfVar1[2];
          fVar168 = fVar168 - pfVar1[3];
          local_10b8 = fVar163 * fVar87 - fVar120 * fVar149;
          fStack_10b4 = fVar164 * fVar89 - fVar122 * fVar151;
          fStack_10b0 = fVar166 * fVar118 - fVar124 * fVar152;
          fStack_10ac = fVar168 * fVar119 - fVar126 * fVar153;
          fStack_1284 = *(float *)(ray + k * 4 + 0x20);
          fVar113 = *(float *)(ray + k * 4 + 0x60);
          auVar110._4_4_ = fVar113;
          auVar110._0_4_ = fVar113;
          auVar110._8_4_ = fVar113;
          auVar110._12_4_ = fVar113;
          fVar154 = fVar154 - fStack_1284;
          fVar158 = fVar158 - fStack_1284;
          fVar160 = fVar160 - fStack_1284;
          fVar162 = fVar162 - fStack_1284;
          fVar128 = fVar154 * fVar135 - local_f88 * fVar113;
          fVar129 = fVar158 * fVar135 - fStack_f84 * fVar113;
          fVar130 = fVar160 * fVar135 - fStack_f80 * fVar113;
          fVar131 = fVar162 * fVar135 - fStack_f7c * fVar113;
          fVar133 = fVar132 * fVar149 - fVar163 * fVar61;
          fVar137 = fVar136 * fVar151 - fVar164 * fVar64;
          fVar140 = fVar139 * fVar152 - fVar166 * fVar76;
          fVar143 = fVar142 * fVar153 - fVar168 * fVar84;
          fVar121 = fVar91 * fVar113 - fVar154 * fStack_12b4;
          fVar123 = fVar97 * fVar113 - fVar158 * fStack_12b4;
          fVar125 = fVar98 * fVar113 - fVar160 * fStack_12b4;
          fVar127 = fVar99 * fVar113 - fVar162 * fStack_12b4;
          fVar145 = local_10f8[0] * fVar135 + local_10b8 * fStack_12b4 + fVar133 * fVar113;
          fVar146 = local_10f8[1] * fVar135 + fStack_10b4 * fStack_12b4 + fVar137 * fVar113;
          fVar147 = local_10f8[2] * fVar135 + fStack_10b0 * fStack_12b4 + fVar140 * fVar113;
          fVar148 = local_10f8[3] * fVar135 + fStack_10ac * fStack_12b4 + fVar143 * fVar113;
          uVar42 = (uint)fVar145 & 0x80000000;
          uVar60 = (uint)fVar146 & 0x80000000;
          uVar62 = (uint)fVar147 & 0x80000000;
          uVar65 = (uint)fVar148 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar149 * fVar121 + fVar61 * fVar128 + fVar87 * fVar67) ^ uVar42;
          tNear.field_0.i[1] =
               (uint)(fVar151 * fVar123 + fVar64 * fVar129 + fVar89 * fVar75) ^ uVar60;
          tNear.field_0.i[2] =
               (uint)(fVar152 * fVar125 + fVar76 * fVar130 + fVar118 * fVar41) ^ uVar62;
          tNear.field_0.i[3] =
               (uint)(fVar153 * fVar127 + fVar84 * fVar131 + fVar119 * fVar59) ^ uVar65;
          fVar67 = (float)((uint)(fVar121 * fVar163 + fVar128 * fVar132 + fVar67 * fVar120) ^ uVar42
                          );
          fVar164 = (float)((uint)(fVar123 * fVar164 + fVar129 * fVar136 + fVar75 * fVar122) ^
                           uVar60);
          fVar166 = (float)((uint)(fVar125 * fVar166 + fVar130 * fVar139 + fVar41 * fVar124) ^
                           uVar62);
          fVar168 = (float)((uint)(fVar127 * fVar168 + fVar131 * fVar142 + fVar59 * fVar126) ^
                           uVar65);
          fVar113 = ABS(fVar145);
          fVar163 = ABS(fVar146);
          auVar116._0_8_ = CONCAT44(fVar146,fVar145) & 0x7fffffff7fffffff;
          auVar116._8_4_ = ABS(fVar147);
          auVar116._12_4_ = ABS(fVar148);
          bVar23 = ((0.0 <= fVar67 && 0.0 <= tNear.field_0.v[0]) && fVar145 != 0.0) &&
                   tNear.field_0.v[0] + fVar67 <= fVar113;
          auVar117._0_4_ = -(uint)bVar23;
          bVar24 = ((0.0 <= fVar164 && 0.0 <= tNear.field_0.v[1]) && fVar146 != 0.0) &&
                   tNear.field_0.v[1] + fVar164 <= fVar163;
          auVar117._4_4_ = -(uint)bVar24;
          bVar22 = ((0.0 <= fVar166 && 0.0 <= tNear.field_0.v[2]) && fVar147 != 0.0) &&
                   tNear.field_0.v[2] + fVar166 <= auVar116._8_4_;
          auVar117._8_4_ = -(uint)bVar22;
          bVar21 = ((0.0 <= fVar168 && 0.0 <= tNear.field_0.v[3]) && fVar148 != 0.0) &&
                   tNear.field_0.v[3] + fVar168 <= auVar116._12_4_;
          auVar117._12_4_ = -(uint)bVar21;
          lVar38 = uVar36 + lVar30;
          iVar26 = movmskps((int)lVar30,auVar117);
          local_1218._0_4_ = (float)*(undefined8 *)pfVar3;
          local_1218._4_4_ = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
          local_1268._0_4_ = auVar82._0_4_;
          local_1268._4_4_ = auVar82._4_4_;
          fStack_1260 = auVar82._8_4_;
          fStack_125c = auVar82._12_4_;
          fStack_1210 = fVar63;
          fStack_120c = fVar66;
          fStack_1200 = fVar78;
          fStack_11fc = fVar78;
          if (iVar26 == 0) {
            uVar42 = 0;
          }
          else {
            fVar154 = (float)(uVar42 ^ (uint)(local_f88 * local_10f8[0] +
                                             fVar91 * local_10b8 + fVar154 * fVar133));
            fVar158 = (float)(uVar60 ^ (uint)(fStack_f84 * local_10f8[1] +
                                             fVar97 * fStack_10b4 + fVar158 * fVar137));
            fVar98 = (float)(uVar62 ^ (uint)(fStack_f80 * local_10f8[2] +
                                            fVar98 * fStack_10b0 + fVar160 * fVar140));
            fVar99 = (float)(uVar65 ^ (uint)(fStack_f7c * local_10f8[3] +
                                            fVar99 * fStack_10ac + fVar162 * fVar143));
            fVar91 = *(float *)(ray + k * 4 + 0x30);
            fVar97 = *(float *)(ray + k * 4 + 0x80);
            bVar23 = (fVar154 <= fVar97 * fVar113 && fVar91 * fVar113 < fVar154) && bVar23;
            valid.field_0.i[0] = -(uint)bVar23;
            bVar24 = (fVar158 <= fVar97 * fVar163 && fVar91 * fVar163 < fVar158) && bVar24;
            valid.field_0.i[1] = -(uint)bVar24;
            bVar22 = (fVar98 <= fVar97 * auVar116._8_4_ && fVar91 * auVar116._8_4_ < fVar98) &&
                     bVar22;
            valid.field_0.i[2] = -(uint)bVar22;
            bVar21 = (fVar99 <= fVar97 * auVar116._12_4_ && fVar91 * auVar116._12_4_ < fVar99) &&
                     bVar21;
            valid.field_0.i[3] = -(uint)bVar21;
            auVar19._4_4_ = valid.field_0.i[1];
            auVar19._0_4_ = valid.field_0.i[0];
            auVar19._8_4_ = valid.field_0.i[2];
            auVar19._12_4_ = valid.field_0.i[3];
            uVar42 = movmskps(iVar26,auVar19);
            if (uVar42 != 0) {
              local_10e8._4_4_ = fStack_10b4;
              local_10e8._0_4_ = local_10b8;
              local_10e8._12_4_ = fStack_10ac;
              local_10e8._8_4_ = fStack_10b0;
              local_10c8._8_8_ = uStack_1000;
              local_10c8._0_8_ = local_1008;
              pSVar8 = context->scene;
              auVar82 = rcpps(auVar110,auVar116);
              fVar78 = auVar82._0_4_;
              fVar86 = auVar82._4_4_;
              fVar91 = auVar82._8_4_;
              fVar160 = auVar82._12_4_;
              fVar162 = (float)DAT_01f7ba10;
              fVar63 = DAT_01f7ba10._4_4_;
              fVar66 = DAT_01f7ba10._12_4_;
              fVar135 = DAT_01f7ba10._8_4_;
              fVar78 = (fVar162 - fVar113 * fVar78) * fVar78 + fVar78;
              fVar86 = (fVar63 - fVar163 * fVar86) * fVar86 + fVar86;
              fVar91 = (fVar135 - auVar116._8_4_ * fVar91) * fVar91 + fVar91;
              fVar160 = (fVar66 - auVar116._12_4_ * fVar160) * fVar160 + fVar160;
              fVar154 = fVar154 * fVar78;
              fVar158 = fVar158 * fVar86;
              fVar98 = fVar98 * fVar91;
              fVar99 = fVar99 * fVar160;
              local_1108[0] = fVar154;
              local_1108[1] = fVar158;
              local_1108[2] = fVar98;
              local_1108[3] = fVar99;
              auVar150._0_4_ = tNear.field_0.v[0] * fVar78;
              auVar150._4_4_ = tNear.field_0.v[1] * fVar86;
              auVar150._8_4_ = tNear.field_0.v[2] * fVar91;
              auVar150._12_4_ = tNear.field_0.v[3] * fVar160;
              auVar157 = minps(auVar150,_DAT_01f7ba10);
              auVar80._0_4_ = fVar78 * fVar67;
              auVar80._4_4_ = fVar86 * fVar164;
              auVar80._8_4_ = fVar91 * fVar166;
              auVar80._12_4_ = fVar160 * fVar168;
              auVar82 = minps(auVar80,_DAT_01f7ba10);
              auVar112._0_4_ = fVar162 - auVar157._0_4_;
              auVar112._4_4_ = fVar63 - auVar157._4_4_;
              auVar112._8_4_ = fVar135 - auVar157._8_4_;
              auVar112._12_4_ = fVar66 - auVar157._12_4_;
              auVar101._0_4_ = fVar162 - auVar82._0_4_;
              auVar101._4_4_ = fVar63 - auVar82._4_4_;
              auVar101._8_4_ = fVar135 - auVar82._8_4_;
              auVar101._12_4_ = fVar66 - auVar82._12_4_;
              local_1128 = blendvps(auVar157,auVar112,local_10c8);
              local_1118 = blendvps(auVar82,auVar101,local_10c8);
              local_10d8 = CONCAT44(fVar137,fVar133);
              uStack_10d0 = CONCAT44(fVar143,fVar140);
              auVar49._4_4_ = valid.field_0.i[1];
              auVar49._0_4_ = valid.field_0.i[0];
              auVar49._8_4_ = valid.field_0.i[2];
              auVar49._12_4_ = valid.field_0.i[3];
              auVar17._4_4_ = fVar158;
              auVar17._0_4_ = fVar154;
              auVar17._8_4_ = fVar98;
              auVar17._12_4_ = fVar99;
              auVar157 = blendvps(_DAT_01f7a9f0,auVar17,auVar49);
              auVar102._4_4_ = auVar157._0_4_;
              auVar102._0_4_ = auVar157._4_4_;
              auVar102._8_4_ = auVar157._12_4_;
              auVar102._12_4_ = auVar157._8_4_;
              auVar82 = minps(auVar102,auVar157);
              auVar50._0_8_ = auVar82._8_8_;
              auVar50._8_4_ = auVar82._0_4_;
              auVar50._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar50,auVar82);
              auVar51._0_4_ = -(uint)(auVar82._0_4_ == auVar157._0_4_ && bVar23);
              auVar51._4_4_ = -(uint)(auVar82._4_4_ == auVar157._4_4_ && bVar24);
              auVar51._8_4_ = -(uint)(auVar82._8_4_ == auVar157._8_4_ && bVar22);
              auVar51._12_4_ = -(uint)(auVar82._12_4_ == auVar157._12_4_ && bVar21);
              iVar27 = movmskps((int)pSVar8,auVar51);
              iVar26 = valid.field_0.i[0];
              iVar165 = valid.field_0.i[1];
              iVar167 = valid.field_0.i[2];
              iVar169 = valid.field_0.i[3];
              if (iVar27 != 0) {
                iVar26 = auVar51._0_4_;
                iVar165 = auVar51._4_4_;
                iVar167 = auVar51._8_4_;
                iVar169 = auVar51._12_4_;
              }
              auVar20._4_4_ = iVar165;
              auVar20._0_4_ = iVar26;
              auVar20._8_4_ = iVar167;
              auVar20._12_4_ = iVar169;
              uVar28 = movmskps(iVar27,auVar20);
              uVar31 = CONCAT44((int)((ulong)pSVar8 >> 0x20),uVar28);
              lVar30 = 0;
              local_1268._0_4_ = fVar97;
              local_1268._4_4_ = 0;
              fStack_1260 = (float)0;
              fStack_125c = (float)0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
LAB_00264bc5:
              local_1048._4_4_ = *(uint *)(lVar38 + 0xc0 + lVar30 * 4);
              pGVar9 = (pSVar8->geometries).items[(uint)local_1048._4_4_].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_1268 + lVar30 * 4 + -0x10) = 0;
LAB_00264f0e:
                uVar42 = movmskps((int)lVar30,(undefined1  [16])valid.field_0);
                if (uVar42 == 0) goto LAB_00265690;
                auVar18._4_4_ = fVar158;
                auVar18._0_4_ = fVar154;
                auVar18._8_4_ = fVar98;
                auVar18._12_4_ = fVar99;
                auVar157 = blendvps(_DAT_01f7a9f0,auVar18,(undefined1  [16])valid.field_0);
                auVar103._4_4_ = auVar157._0_4_;
                auVar103._0_4_ = auVar157._4_4_;
                auVar103._8_4_ = auVar157._12_4_;
                auVar103._12_4_ = auVar157._8_4_;
                auVar82 = minps(auVar103,auVar157);
                auVar69._0_8_ = auVar82._8_8_;
                auVar69._8_4_ = auVar82._0_4_;
                auVar69._12_4_ = auVar82._4_4_;
                auVar82 = minps(auVar69,auVar82);
                auVar70._0_8_ =
                     CONCAT44(-(uint)(auVar82._4_4_ == auVar157._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar82._0_4_ == auVar157._0_4_) & valid.field_0._0_4_);
                auVar70._8_4_ = -(uint)(auVar82._8_4_ == auVar157._8_4_) & valid.field_0._8_4_;
                auVar70._12_4_ = -(uint)(auVar82._12_4_ == auVar157._12_4_) & valid.field_0._12_4_;
                iVar26 = movmskps(uVar42,auVar70);
                aVar53 = valid.field_0;
                if (iVar26 != 0) {
                  aVar53.i[2] = auVar70._8_4_;
                  aVar53._0_8_ = auVar70._0_8_;
                  aVar53.i[3] = auVar70._12_4_;
                }
                uVar28 = movmskps(iVar26,(undefined1  [16])aVar53);
                uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
                lVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                goto LAB_00264bc5;
              }
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1078 = *(undefined4 *)(local_1128 + lVar30 * 4);
                local_1068 = local_1108[lVar30 + -4];
                local_10a8._4_4_ = local_10f8[lVar30];
                local_1098._4_4_ = *(undefined4 *)(local_10e8 + lVar30 * 4);
                uVar28 = *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
                local_1058._4_4_ = uVar28;
                local_1058._0_4_ = uVar28;
                local_1058._8_4_ = uVar28;
                local_1058._12_4_ = uVar28;
                local_1088._4_4_ = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
                local_10a8._0_4_ = local_10a8._4_4_;
                fStack_10a0 = (float)local_10a8._4_4_;
                fStack_109c = (float)local_10a8._4_4_;
                local_1098._0_4_ = local_1098._4_4_;
                local_1098._8_4_ = local_1098._4_4_;
                local_1098._12_4_ = local_1098._4_4_;
                local_1088._0_4_ = local_1088._4_4_;
                local_1088._8_4_ = local_1088._4_4_;
                local_1088._12_4_ = local_1088._4_4_;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                fStack_1064 = local_1068;
                fStack_1060 = local_1068;
                fStack_105c = local_1068;
                local_1048._0_4_ = local_1048._4_4_;
                local_1048._8_4_ = local_1048._4_4_;
                local_1048._12_4_ = local_1048._4_4_;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
                local_1238 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(int)uVar34 * 0x10);
                args.valid = (int *)local_1238;
                args.geometryUserPtr = pGVar9->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                local_1228 = fVar154;
                fStack_1224 = fVar158;
                fStack_1220 = fVar98;
                fStack_121c = fVar99;
                local_1218 = lVar38;
                local_1208 = uVar32;
                args.ray = (RTCRayN *)ray;
                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->intersectionFilterN)(&args);
                }
                if (local_1238 == (undefined1  [16])0x0) {
                  auVar68._8_4_ = 0xffffffff;
                  auVar68._0_8_ = 0xffffffffffffffff;
                  auVar68._12_4_ = 0xffffffff;
                  auVar68 = auVar68 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&args);
                  }
                  auVar52._0_4_ = -(uint)(local_1238._0_4_ == 0);
                  auVar52._4_4_ = -(uint)(local_1238._4_4_ == 0);
                  auVar52._8_4_ = -(uint)(local_1238._8_4_ == 0);
                  auVar52._12_4_ = -(uint)(local_1238._12_4_ == 0);
                  auVar68 = auVar52 ^ _DAT_01f7ae20;
                  if (local_1238 != (undefined1  [16])0x0) {
                    auVar82 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar52);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
                  }
                }
                if ((_DAT_01f7bb20 & auVar68) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1268._0_4_;
                }
                else {
                  _local_1268 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_1268 + lVar30 * 4 + -0x10) = 0;
                valid.field_0.i[0] =
                     -(uint)(local_1228 <= (float)local_1268._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fStack_1224 <= (float)local_1268._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fStack_1220 <= (float)local_1268._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fStack_121c <= (float)local_1268._0_4_) & valid.field_0.i[3];
                uVar32 = local_1208;
                lVar38 = local_1218;
                fVar154 = local_1228;
                fVar158 = fStack_1224;
                fVar98 = fStack_1220;
                fVar99 = fStack_121c;
                goto LAB_00264f0e;
              }
              uVar28 = *(undefined4 *)(local_1128 + lVar30 * 4);
              fVar78 = local_1108[lVar30 + -4];
              *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
              *(float *)(ray + k * 4 + 0xc0) = local_10f8[lVar30];
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar30 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
              *(float *)(ray + k * 4 + 0x100) = fVar78;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11b8 + lVar30 * 4)
              ;
              *(undefined4 *)(ray + k * 4 + 0x120) = local_1048._4_4_;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar42 = context->user->instPrimID[0];
              *(uint *)(ray + k * 4 + 0x140) = uVar42;
LAB_00265690:
              local_12c8 = *(undefined8 *)(lVar38 + 0x30);
              uStack_12c0 = *(undefined8 *)(lVar38 + 0x38);
              local_1248 = *(undefined8 *)(lVar38 + 0x40);
              uStack_1240 = *(undefined8 *)(lVar38 + 0x48);
              local_12a8 = *(undefined8 *)(lVar38 + 0x50);
              uStack_12a0 = *(undefined8 *)(lVar38 + 0x58);
              local_1218._0_4_ = *(float *)(lVar38 + 0x90);
              local_1218._4_4_ = *(float *)(lVar38 + 0x94);
              fVar63 = *(float *)(lVar38 + 0x98);
              fVar66 = *(float *)(lVar38 + 0x9c);
              local_1268._0_4_ = *(float *)(lVar38 + 0xa0);
              local_1268._4_4_ = *(float *)(lVar38 + 0xa4);
              fStack_1260 = *(float *)(lVar38 + 0xa8);
              fStack_125c = *(float *)(lVar38 + 0xac);
              fVar134 = *(float *)(lVar38 + 0xb0);
              fVar138 = *(float *)(lVar38 + 0xb4);
              fVar141 = *(float *)(lVar38 + 0xb8);
              fVar144 = *(float *)(lVar38 + 0xbc);
              fVar78 = *(float *)(ray + k * 4);
              fVar86 = *(float *)(ray + k * 4 + 0x10);
              fStack_1284 = *(float *)(ray + k * 4 + 0x20);
              fVar135 = *(float *)(ray + k * 4 + 0x40);
              fStack_12b4 = *(float *)(ray + k * 4 + 0x50);
              uVar28 = *(undefined4 *)(ray + k * 4 + 0x60);
              auVar110._4_4_ = uVar28;
              auVar110._0_4_ = uVar28;
              auVar110._8_4_ = uVar28;
              auVar110._12_4_ = uVar28;
            }
          }
          fVar113 = *(float *)(lVar38 + 0x60);
          fVar163 = *(float *)(lVar38 + 100);
          fVar164 = *(float *)(lVar38 + 0x68);
          fVar166 = *(float *)(lVar38 + 0x6c);
          fVar168 = *(float *)(lVar38 + 0x70);
          fVar91 = *(float *)(lVar38 + 0x74);
          fVar97 = *(float *)(lVar38 + 0x78);
          fVar98 = *(float *)(lVar38 + 0x7c);
          fVar99 = *(float *)(lVar38 + 0x80);
          fVar154 = *(float *)(lVar38 + 0x84);
          fVar158 = *(float *)(lVar38 + 0x88);
          fVar160 = *(float *)(lVar38 + 0x8c);
          local_1218._0_4_ = fVar113 - (float)local_1218;
          local_1218._4_4_ = fVar163 - local_1218._4_4_;
          fVar63 = fVar164 - fVar63;
          fVar66 = fVar166 - fVar66;
          local_1268._0_4_ = fVar168 - (float)local_1268._0_4_;
          local_1268._4_4_ = fVar91 - (float)local_1268._4_4_;
          fStack_1260 = fVar97 - fStack_1260;
          fStack_125c = fVar98 - fStack_125c;
          fVar134 = fVar99 - fVar134;
          fVar138 = fVar154 - fVar138;
          fVar141 = fVar158 - fVar141;
          fVar144 = fVar160 - fVar144;
          local_12c8._0_4_ = (float)local_12c8 - fVar113;
          local_12c8._4_4_ = local_12c8._4_4_ - fVar163;
          uStack_12c0._0_4_ = (float)uStack_12c0 - fVar164;
          uStack_12c0._4_4_ = uStack_12c0._4_4_ - fVar166;
          local_1248._0_4_ = (float)local_1248 - fVar168;
          local_1248._4_4_ = local_1248._4_4_ - fVar91;
          uStack_1240._0_4_ = (float)uStack_1240 - fVar97;
          uStack_1240._4_4_ = uStack_1240._4_4_ - fVar98;
          fVar162 = (float)local_12a8 - fVar99;
          fVar67 = local_12a8._4_4_ - fVar154;
          fVar75 = (float)uStack_12a0 - fVar158;
          fVar41 = uStack_12a0._4_4_ - fVar160;
          fVar113 = fVar113 - fVar78;
          fVar163 = fVar163 - fVar78;
          fVar164 = fVar164 - fVar78;
          fVar166 = fVar166 - fVar78;
          fVar99 = fVar99 - fStack_1284;
          fVar154 = fVar154 - fStack_1284;
          fVar158 = fVar158 - fStack_1284;
          fVar160 = fVar160 - fStack_1284;
          fVar64 = auVar110._0_4_;
          fVar84 = auVar110._4_4_;
          fVar89 = auVar110._8_4_;
          fVar119 = auVar110._12_4_;
          fVar125 = fVar99 * fVar135 - fVar113 * fVar64;
          fVar126 = fVar154 * fVar135 - fVar163 * fVar84;
          fVar127 = fVar158 * fVar135 - fVar164 * fVar89;
          fVar128 = fVar160 * fVar135 - fVar166 * fVar119;
          local_10f8[0] = fVar134 * (float)local_1248 - (float)local_1268._0_4_ * fVar162;
          local_10f8[1] = fVar138 * local_1248._4_4_ - (float)local_1268._4_4_ * fVar67;
          local_10f8[2] = fVar141 * (float)uStack_1240 - fStack_1260 * fVar75;
          local_10f8[3] = fVar144 * uStack_1240._4_4_ - fStack_125c * fVar41;
          fVar168 = fVar168 - fVar86;
          fVar91 = fVar91 - fVar86;
          fVar97 = fVar97 - fVar86;
          fVar98 = fVar98 - fVar86;
          fVar78 = fVar113 * fStack_12b4 - fVar168 * fVar135;
          fVar86 = fVar163 * fStack_12b4 - fVar91 * fVar135;
          fVar59 = fVar164 * fStack_12b4 - fVar97 * fVar135;
          fVar61 = fVar166 * fStack_12b4 - fVar98 * fVar135;
          local_10e8._0_4_ = (float)local_1218 * fVar162 - fVar134 * (float)local_12c8;
          local_10e8._4_4_ = local_1218._4_4_ * fVar67 - fVar138 * local_12c8._4_4_;
          local_10e8._8_4_ = fVar63 * fVar75 - fVar141 * (float)uStack_12c0;
          local_10e8._12_4_ = fVar66 * fVar41 - fVar144 * uStack_12c0._4_4_;
          fVar76 = (float)local_1268._0_4_ * (float)local_12c8 -
                   (float)local_1218 * (float)local_1248;
          fVar87 = (float)local_1268._4_4_ * local_12c8._4_4_ - local_1218._4_4_ * local_1248._4_4_;
          fVar118 = fStack_1260 * (float)uStack_12c0 - fVar63 * (float)uStack_1240;
          fVar120 = fStack_125c * uStack_12c0._4_4_ - fVar66 * uStack_1240._4_4_;
          fVar121 = fVar168 * fVar64 - fVar99 * fStack_12b4;
          fVar122 = fVar91 * fVar84 - fVar154 * fStack_12b4;
          fVar123 = fVar97 * fVar89 - fVar158 * fStack_12b4;
          fVar124 = fVar98 * fVar119 - fVar160 * fStack_12b4;
          local_12a8 = CONCAT44(fVar87,fVar76);
          uStack_12a0 = CONCAT44(fVar120,fVar118);
          fVar64 = fVar135 * local_10f8[0] + fStack_12b4 * (float)local_10e8._0_4_ + fVar64 * fVar76
          ;
          fVar84 = fVar135 * local_10f8[1] + fStack_12b4 * (float)local_10e8._4_4_ + fVar84 * fVar87
          ;
          fVar89 = fVar135 * local_10f8[2] +
                   fStack_12b4 * (float)local_10e8._8_4_ + fVar89 * fVar118;
          fVar119 = fVar135 * local_10f8[3] +
                    fStack_12b4 * (float)local_10e8._12_4_ + fVar119 * fVar120;
          uVar60 = (uint)fVar64 & 0x80000000;
          uVar62 = (uint)fVar84 & 0x80000000;
          uVar65 = (uint)fVar89 & 0x80000000;
          uVar77 = (uint)fVar119 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)((float)local_12c8 * fVar121 + (float)local_1248 * fVar125 + fVar162 * fVar78)
               ^ uVar60;
          tNear.field_0.i[1] =
               (uint)(local_12c8._4_4_ * fVar122 + local_1248._4_4_ * fVar126 + fVar67 * fVar86) ^
               uVar62;
          tNear.field_0.i[2] =
               (uint)((float)uStack_12c0 * fVar123 + (float)uStack_1240 * fVar127 + fVar75 * fVar59)
               ^ uVar65;
          tNear.field_0.i[3] =
               (uint)(uStack_12c0._4_4_ * fVar124 + uStack_1240._4_4_ * fVar128 + fVar41 * fVar61) ^
               uVar77;
          fVar135 = (float)((uint)(fVar121 * (float)local_1218 +
                                  fVar125 * (float)local_1268._0_4_ + fVar78 * fVar134) ^ uVar60);
          fVar162 = (float)((uint)(fVar122 * local_1218._4_4_ +
                                  fVar126 * (float)local_1268._4_4_ + fVar86 * fVar138) ^ uVar62);
          fVar63 = (float)((uint)(fVar123 * fVar63 + fVar127 * fStack_1260 + fVar59 * fVar141) ^
                          uVar65);
          fVar66 = (float)((uint)(fVar124 * fVar66 + fVar128 * fStack_125c + fVar61 * fVar144) ^
                          uVar77);
          fVar78 = ABS(fVar64);
          fVar86 = ABS(fVar84);
          auVar111._0_8_ = CONCAT44(fVar84,fVar64) & 0x7fffffff7fffffff;
          auVar111._8_4_ = ABS(fVar89);
          auVar111._12_4_ = ABS(fVar119);
          bVar23 = tNear.field_0.v[0] + fVar135 <= fVar78 &&
                   ((0.0 <= fVar135 && 0.0 <= tNear.field_0.v[0]) && fVar64 != 0.0);
          auVar93._0_4_ = -(uint)bVar23;
          bVar24 = tNear.field_0.v[1] + fVar162 <= fVar86 &&
                   ((0.0 <= fVar162 && 0.0 <= tNear.field_0.v[1]) && fVar84 != 0.0);
          auVar93._4_4_ = -(uint)bVar24;
          bVar22 = tNear.field_0.v[2] + fVar63 <= auVar111._8_4_ &&
                   ((0.0 <= fVar63 && 0.0 <= tNear.field_0.v[2]) && fVar89 != 0.0);
          auVar93._8_4_ = -(uint)bVar22;
          bVar21 = tNear.field_0.v[3] + fVar66 <= auVar111._12_4_ &&
                   ((0.0 <= fVar66 && 0.0 <= tNear.field_0.v[3]) && fVar119 != 0.0);
          auVar93._12_4_ = -(uint)bVar21;
          iVar26 = movmskps(uVar42,auVar93);
          if (iVar26 != 0) {
            fVar168 = (float)(uVar60 ^ (uint)(fVar113 * local_10f8[0] +
                                             fVar168 * (float)local_10e8._0_4_ + fVar99 * fVar76));
            fVar163 = (float)(uVar62 ^ (uint)(fVar163 * local_10f8[1] +
                                             fVar91 * (float)local_10e8._4_4_ + fVar154 * fVar87));
            fVar164 = (float)(uVar65 ^ (uint)(fVar164 * local_10f8[2] +
                                             fVar97 * (float)local_10e8._8_4_ + fVar158 * fVar118));
            fVar166 = (float)(uVar77 ^ (uint)(fVar166 * local_10f8[3] +
                                             fVar98 * (float)local_10e8._12_4_ + fVar160 * fVar120))
            ;
            fVar113 = *(float *)(ray + k * 4 + 0x30);
            bVar11 = fVar113 * fVar78 < fVar168;
            bVar12 = fVar113 * fVar86 < fVar163;
            bVar13 = fVar113 * auVar111._8_4_ < fVar164;
            bVar14 = fVar113 * auVar111._12_4_ < fVar166;
            auVar81._4_4_ = -(uint)bVar12;
            auVar81._0_4_ = -(uint)bVar11;
            auVar81._8_4_ = -(uint)bVar13;
            auVar81._12_4_ = -(uint)bVar14;
            local_1268._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_1268._4_4_ = 0;
            fStack_1260 = 0.0;
            fStack_125c = 0.0;
            bVar23 = (fVar168 <= (float)local_1268._0_4_ * fVar78 && bVar11) && bVar23;
            bVar24 = (fVar163 <= (float)local_1268._0_4_ * fVar86 && bVar12) && bVar24;
            valid.field_0._0_8_ = CONCAT44(-(uint)bVar24,-(uint)bVar23);
            bVar22 = (fVar164 <= (float)local_1268._0_4_ * auVar111._8_4_ && bVar13) && bVar22;
            valid.field_0.i[2] = -(uint)bVar22;
            bVar21 = (fVar166 <= (float)local_1268._0_4_ * auVar111._12_4_ && bVar14) && bVar21;
            valid.field_0.i[3] = -(uint)bVar21;
            iVar26 = movmskps(iVar26,(undefined1  [16])valid.field_0);
            if (iVar26 != 0) {
              local_10c8._8_8_ = uStack_1010;
              local_10c8._0_8_ = local_1018;
              pSVar8 = context->scene;
              auVar82 = rcpps(auVar81,auVar111);
              fVar113 = auVar82._0_4_;
              fVar91 = auVar82._4_4_;
              fVar97 = auVar82._8_4_;
              fVar98 = auVar82._12_4_;
              fVar154 = (float)DAT_01f7ba10;
              fVar158 = DAT_01f7ba10._4_4_;
              fVar160 = DAT_01f7ba10._12_4_;
              fVar99 = DAT_01f7ba10._8_4_;
              fVar113 = (fVar154 - fVar78 * fVar113) * fVar113 + fVar113;
              fVar91 = (fVar158 - fVar86 * fVar91) * fVar91 + fVar91;
              fVar97 = (fVar99 - auVar111._8_4_ * fVar97) * fVar97 + fVar97;
              fVar98 = (fVar160 - auVar111._12_4_ * fVar98) * fVar98 + fVar98;
              fVar168 = fVar168 * fVar113;
              fVar163 = fVar163 * fVar91;
              fVar164 = fVar164 * fVar97;
              fVar166 = fVar166 * fVar98;
              local_1108[0] = fVar168;
              local_1108[1] = fVar163;
              local_1108[2] = fVar164;
              local_1108[3] = fVar166;
              auVar156._0_4_ = tNear.field_0.v[0] * fVar113;
              auVar156._4_4_ = tNear.field_0.v[1] * fVar91;
              auVar156._8_4_ = tNear.field_0.v[2] * fVar97;
              auVar156._12_4_ = tNear.field_0.v[3] * fVar98;
              auVar157 = minps(auVar156,_DAT_01f7ba10);
              auVar94._0_4_ = fVar113 * fVar135;
              auVar94._4_4_ = fVar91 * fVar162;
              auVar94._8_4_ = fVar97 * fVar63;
              auVar94._12_4_ = fVar98 * fVar66;
              auVar82 = minps(auVar94,_DAT_01f7ba10);
              auVar83._0_4_ = fVar154 - auVar157._0_4_;
              auVar83._4_4_ = fVar158 - auVar157._4_4_;
              auVar83._8_4_ = fVar99 - auVar157._8_4_;
              auVar83._12_4_ = fVar160 - auVar157._12_4_;
              auVar104._0_4_ = fVar154 - auVar82._0_4_;
              auVar104._4_4_ = fVar158 - auVar82._4_4_;
              auVar104._8_4_ = fVar99 - auVar82._8_4_;
              auVar104._12_4_ = fVar160 - auVar82._12_4_;
              local_1128 = blendvps(auVar157,auVar83,local_10c8);
              local_1118 = blendvps(auVar82,auVar104,local_10c8);
              local_10d8 = local_12a8;
              uStack_10d0 = uStack_12a0;
              auVar54._8_4_ = valid.field_0.i[2];
              auVar54._0_8_ = valid.field_0._0_8_;
              auVar54._12_4_ = valid.field_0.i[3];
              auVar15._4_4_ = fVar163;
              auVar15._0_4_ = fVar168;
              auVar15._8_4_ = fVar164;
              auVar15._12_4_ = fVar166;
              auVar157 = blendvps(_DAT_01f7a9f0,auVar15,auVar54);
              auVar95._4_4_ = auVar157._0_4_;
              auVar95._0_4_ = auVar157._4_4_;
              auVar95._8_4_ = auVar157._12_4_;
              auVar95._12_4_ = auVar157._8_4_;
              auVar82 = minps(auVar95,auVar157);
              auVar55._0_8_ = auVar82._8_8_;
              auVar55._8_4_ = auVar82._0_4_;
              auVar55._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar55,auVar82);
              auVar56._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar157._4_4_ && bVar24),
                            -(uint)(auVar82._0_4_ == auVar157._0_4_ && bVar23));
              auVar56._8_4_ = -(uint)(auVar82._8_4_ == auVar157._8_4_ && bVar22);
              auVar56._12_4_ = -(uint)(auVar82._12_4_ == auVar157._12_4_ && bVar21);
              iVar26 = movmskps((int)pSVar8,auVar56);
              aVar71 = valid.field_0;
              if (iVar26 != 0) {
                aVar71.i[2] = auVar56._8_4_;
                aVar71._0_8_ = auVar56._0_8_;
                aVar71.i[3] = auVar56._12_4_;
              }
              uVar28 = movmskps(iVar26,(undefined1  [16])aVar71);
              uVar31 = CONCAT44((int)((ulong)pSVar8 >> 0x20),uVar28);
              lVar30 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
LAB_00265194:
              uVar42 = *(uint *)(lVar38 + 0xc0 + lVar30 * 4);
              pGVar9 = (pSVar8->geometries).items[uVar42].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_1268 + lVar30 * 4 + -0x10) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar28 = *(undefined4 *)(local_1128 + lVar30 * 4);
                  fVar78 = local_1108[lVar30 + -4];
                  *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
                  *(float *)(ray + k * 4 + 0xc0) = local_10f8[lVar30];
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar28;
                  *(float *)(ray + k * 4 + 0x100) = fVar78;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar42;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_002649fa;
                }
                local_1078 = *(undefined4 *)(local_1128 + lVar30 * 4);
                local_1068 = local_1108[lVar30 + -4];
                fVar78 = local_10f8[lVar30];
                uVar28 = *(undefined4 *)(local_10e8 + lVar30 * 4);
                local_1048._4_4_ = uVar42;
                local_1048._0_4_ = uVar42;
                local_1048._8_4_ = uVar42;
                local_1048._12_4_ = uVar42;
                uVar6 = *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
                local_1058._4_4_ = uVar6;
                local_1058._0_4_ = uVar6;
                local_1058._8_4_ = uVar6;
                local_1058._12_4_ = uVar6;
                local_10a8._4_4_ = fVar78;
                local_10a8._0_4_ = fVar78;
                fStack_10a0 = fVar78;
                fStack_109c = fVar78;
                local_1098._4_4_ = uVar28;
                local_1098._0_4_ = uVar28;
                local_1098._8_4_ = uVar28;
                local_1098._12_4_ = uVar28;
                uVar28 = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
                local_1088._4_4_ = uVar28;
                local_1088._0_4_ = uVar28;
                local_1088._8_4_ = uVar28;
                local_1088._12_4_ = uVar28;
                uStack_1074 = local_1078;
                uStack_1070 = local_1078;
                uStack_106c = local_1078;
                fStack_1064 = local_1068;
                fStack_1060 = local_1068;
                fStack_105c = local_1068;
                local_1038 = context->user->instID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1028 = context->user->instPrimID[0];
                uStack_1024 = local_1028;
                uStack_1020 = local_1028;
                uStack_101c = local_1028;
                *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
                local_1238 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(int)uVar34 * 0x10);
                args.valid = (int *)local_1238;
                args.geometryUserPtr = pGVar9->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_10a8;
                args.N = 4;
                local_1228 = fVar168;
                fStack_1224 = fVar163;
                fStack_1220 = fVar164;
                fStack_121c = fVar166;
                local_1218 = lVar38;
                local_1208 = uVar32;
                args.ray = (RTCRayN *)ray;
                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->intersectionFilterN)(&args);
                }
                if (local_1238 == (undefined1  [16])0x0) {
                  auVar72._8_4_ = 0xffffffff;
                  auVar72._0_8_ = 0xffffffffffffffff;
                  auVar72._12_4_ = 0xffffffff;
                  auVar72 = auVar72 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&args);
                  }
                  auVar57._0_4_ = -(uint)(local_1238._0_4_ == 0);
                  auVar57._4_4_ = -(uint)(local_1238._4_4_ == 0);
                  auVar57._8_4_ = -(uint)(local_1238._8_4_ == 0);
                  auVar57._12_4_ = -(uint)(local_1238._12_4_ == 0);
                  auVar72 = auVar57 ^ _DAT_01f7ae20;
                  if (local_1238 != (undefined1  [16])0x0) {
                    auVar82 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                    auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar57);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
                  }
                }
                if ((_DAT_01f7bb20 & auVar72) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1268._0_4_;
                }
                else {
                  _local_1268 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_1268 + lVar30 * 4 + -0x10) = 0;
                valid.field_0.i[0] =
                     -(uint)(local_1228 <= (float)local_1268._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fStack_1224 <= (float)local_1268._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fStack_1220 <= (float)local_1268._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fStack_121c <= (float)local_1268._0_4_) & valid.field_0.i[3];
                uVar32 = local_1208;
                lVar38 = local_1218;
                fVar168 = local_1228;
                fVar163 = fStack_1224;
                fVar164 = fStack_1220;
                fVar166 = fStack_121c;
              }
              iVar26 = movmskps((int)lVar30,(undefined1  [16])valid.field_0);
              if (iVar26 == 0) goto LAB_002649fa;
              auVar16._4_4_ = fVar163;
              auVar16._0_4_ = fVar168;
              auVar16._8_4_ = fVar164;
              auVar16._12_4_ = fVar166;
              auVar157 = blendvps(_DAT_01f7a9f0,auVar16,(undefined1  [16])valid.field_0);
              auVar96._4_4_ = auVar157._0_4_;
              auVar96._0_4_ = auVar157._4_4_;
              auVar96._8_4_ = auVar157._12_4_;
              auVar96._12_4_ = auVar157._8_4_;
              auVar82 = minps(auVar96,auVar157);
              auVar73._0_8_ = auVar82._8_8_;
              auVar73._8_4_ = auVar82._0_4_;
              auVar73._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar73,auVar82);
              auVar74._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar157._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar82._0_4_ == auVar157._0_4_) & valid.field_0._0_4_);
              auVar74._8_4_ = -(uint)(auVar82._8_4_ == auVar157._8_4_) & valid.field_0._8_4_;
              auVar74._12_4_ = -(uint)(auVar82._12_4_ == auVar157._12_4_) & valid.field_0._12_4_;
              iVar26 = movmskps(iVar26,auVar74);
              aVar58 = valid.field_0;
              if (iVar26 != 0) {
                aVar58.i[2] = auVar74._8_4_;
                aVar58._0_8_ = auVar74._0_8_;
                aVar58.i[3] = auVar74._12_4_;
              }
              uVar28 = movmskps(iVar26,(undefined1  [16])aVar58);
              uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
              lVar30 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              goto LAB_00265194;
            }
          }
LAB_002649fa:
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar35);
      }
      iVar167 = *(int *)(ray + k * 4 + 0x80);
      fVar166 = local_f98;
      fVar168 = fStack_f94;
      fVar91 = fStack_f90;
      fVar78 = fStack_f8c;
      fVar97 = local_fa8;
      fVar98 = fStack_fa4;
      fVar99 = fStack_fa0;
      fVar86 = fStack_f9c;
      fVar154 = local_fb8;
      fVar158 = fStack_fb4;
      fVar160 = fStack_fb0;
      fVar135 = fStack_fac;
      fVar162 = local_fc8;
      fVar63 = fStack_fc4;
      fVar66 = fStack_fc0;
      fVar113 = fStack_fbc;
      fVar134 = local_fe8;
      fVar138 = fStack_fe4;
      fVar141 = fStack_fe0;
      fVar164 = fStack_fdc;
      iVar169 = iVar167;
      iVar27 = iVar167;
      iVar165 = iVar167;
      fVar144 = local_fd8;
      fVar67 = fStack_fd4;
      fVar75 = fStack_fd0;
      fVar163 = fStack_fcc;
      iVar155 = local_ff8;
      iVar159 = iStack_ff4;
      iVar161 = iStack_ff0;
      iVar26 = iStack_fec;
    }
    if (pSVar29 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }